

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall OpenMD::SelectionSet::countBits(SelectionSet *this)

{
  int iVar1;
  reference pvVar2;
  allocator_type *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i;
  vector<int,_std::allocator<int>_> *result;
  vector<int,_std::allocator<int>_> *this_00;
  undefined1 *__n;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 local_19;
  undefined4 local_18;
  undefined1 local_11;
  allocator_type *this_01;
  
  local_11 = 0;
  local_18 = 0;
  __n = &local_19;
  this_00 = in_RDI;
  this_01 = in_RSI;
  std::allocator<int>::allocator((allocator<int> *)0x288341);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(size_type)__n,
             (value_type_conflict *)this_00,in_RSI);
  std::allocator<int>::~allocator((allocator<int> *)0x288366);
  for (iVar3 = 0; iVar3 < 6; iVar3 = iVar3 + 1) {
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)in_RSI,
               (long)iVar3);
    iVar1 = OpenMDBitSet::countBits((OpenMDBitSet *)this_01);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar3);
    *pvVar2 = iVar1;
  }
  return in_RDI;
}

Assistant:

std::vector<int> SelectionSet::countBits() {
    std::vector<int> result(N_SELECTIONTYPES, 0);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].countBits();
    return result;
  }